

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_pmon_mips64(CPUMIPSState_conflict5 *env,int function)

{
  int iVar1;
  uchar *fmt;
  int function_local;
  CPUMIPSState_conflict5 *env_local;
  
  iVar1 = function / 2;
  if (iVar1 == 2) {
    if ((env->active_tc).gpr[4] == 0) {
      (env->active_tc).gpr[2] = 0xffffffffffffffff;
    }
LAB_00bcc8d8:
    (env->active_tc).gpr[2] = 0xffffffffffffffff;
  }
  else {
    if (iVar1 != 3) {
      if (iVar1 == 0xb) goto LAB_00bcc8d8;
      if (iVar1 != 0xc) {
        if (iVar1 == 0x11) {
          return;
        }
        if (iVar1 != 0x9e) {
          return;
        }
        printf("%s",(env->active_tc).gpr[4]);
        return;
      }
    }
    printf("%c",(ulong)(uint)(int)(char)(env->active_tc).gpr[4]);
  }
  return;
}

Assistant:

void helper_pmon(CPUMIPSState *env, int function)
{
    function /= 2;
    switch (function) {
    case 2: /* TODO: char inbyte(int waitflag); */
        if (env->active_tc.gpr[4] == 0) {
            env->active_tc.gpr[2] = -1;
        }
        /* Fall through */
    case 11: /* TODO: char inbyte (void); */
        env->active_tc.gpr[2] = -1;
        break;
    case 3:
    case 12:
        printf("%c", (char)(env->active_tc.gpr[4] & 0xFF));
        break;
    case 17:
        break;
    case 158:
        {
            unsigned char *fmt = (void *)(uintptr_t)env->active_tc.gpr[4];
            printf("%s", fmt);
        }
        break;
    }
}